

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O2

uint cio_write(opj_cio_t *cio,unsigned_long_long v,int n)

{
  opj_bool oVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = n + 1;
  iVar2 = n * 8;
  do {
    iVar2 = iVar2 + -8;
    iVar3 = iVar3 + -1;
    if (iVar3 < 1) {
      return n;
    }
    oVar1 = cio_byteout(cio,(uchar)(v >> ((byte)iVar2 & 0x3f)));
  } while (oVar1 != 0);
  return 0;
}

Assistant:

unsigned int cio_write(opj_cio_t *cio, unsigned long long int v, int n) {
	int i;
	for (i = n - 1; i >= 0; i--) {
		if( !cio_byteout(cio, (unsigned char) ((v >> (i << 3)) & 0xff)) )
			return 0;
	}
	return n;
}